

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_pack(REF_INTERP ref_interp,REF_INT *n2o)

{
  int iVar1;
  int max_00;
  int iVar2;
  long lVar3;
  void *pvVar4;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT max;
  REF_INT n;
  REF_INT node;
  REF_INT i;
  REF_DBL *dbl_copy;
  REF_INT *int_copy;
  REF_INT *n2o_local;
  REF_INTERP ref_interp_local;
  
  if (ref_interp == (REF_INTERP)0x0) {
    ref_interp_local._4_4_ = 0;
  }
  else {
    iVar1 = ref_interp->to_grid->node->n;
    max_00 = ref_interp->max;
    if ((max_00 < iVar1) &&
       (ref_interp_local._4_4_ = ref_interp_resize(ref_interp,max_00), ref_interp_local._4_4_ != 0))
    {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x13a,"ref_interp_pack",(ulong)ref_interp_local._4_4_,"match node max");
    }
    else {
      lVar3 = (long)ref_interp->ref_agents->n;
      if (lVar3 == 0) {
        for (max = 0; max < max_00; max = max + 1) {
          if ((long)ref_interp->agent_hired[max] != 0) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x13f,"ref_interp_pack","can\'t pack hired agents",0,
                   (long)ref_interp->agent_hired[max]);
            return 1;
          }
        }
        if (max_00 < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x142,"ref_interp_pack","malloc int_copy of REF_INT negative");
          ref_interp_local._4_4_ = 1;
        }
        else {
          pvVar4 = malloc((long)max_00 << 2);
          if (pvVar4 == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x142,"ref_interp_pack","malloc int_copy of REF_INT NULL");
            ref_interp_local._4_4_ = 2;
          }
          else {
            for (max = 0; max < max_00; max = max + 1) {
              *(REF_INT *)((long)pvVar4 + (long)max * 4) = ref_interp->cell[max];
            }
            for (max = 0; iVar2 = iVar1, max < iVar1; max = max + 1) {
              ref_interp->cell[max] = *(REF_INT *)((long)pvVar4 + (long)n2o[max] * 4);
            }
            while (max = iVar2, max < max_00) {
              ref_interp->cell[max] = -1;
              iVar2 = max + 1;
            }
            for (max = 0; max < max_00; max = max + 1) {
              *(REF_INT *)((long)pvVar4 + (long)max * 4) = ref_interp->part[max];
            }
            for (max = 0; iVar2 = iVar1, max < iVar1; max = max + 1) {
              ref_interp->part[max] = *(REF_INT *)((long)pvVar4 + (long)n2o[max] * 4);
            }
            while (max = iVar2, max < max_00) {
              ref_interp->part[max] = -1;
              iVar2 = max + 1;
            }
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
            if (max_00 * 4 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x157,"ref_interp_pack","malloc dbl_copy of REF_DBL negative");
              ref_interp_local._4_4_ = 1;
            }
            else {
              pvVar4 = malloc((long)(max_00 << 2) << 3);
              if (pvVar4 == (void *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x157,"ref_interp_pack","malloc dbl_copy of REF_DBL NULL");
                ref_interp_local._4_4_ = 2;
              }
              else {
                for (max = 0; max < max_00; max = max + 1) {
                  for (n = 0; n < 4; n = n + 1) {
                    *(REF_DBL *)((long)pvVar4 + (long)(n + max * 4) * 8) =
                         ref_interp->bary[n + max * 4];
                  }
                }
                for (max = 0; max < iVar1; max = max + 1) {
                  for (n = 0; n < 4; n = n + 1) {
                    ref_interp->bary[n + max * 4] =
                         *(REF_DBL *)((long)pvVar4 + (long)(n + n2o[max] * 4) * 8);
                  }
                }
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
                ref_interp_local._4_4_ = 0;
              }
            }
          }
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x13c,"ref_interp_pack","can\'t pack active agents",0,lVar3);
        ref_interp_local._4_4_ = 1;
      }
    }
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_interp_pack(REF_INTERP ref_interp, REF_INT *n2o) {
  REF_INT *int_copy;
  REF_DBL *dbl_copy;
  REF_INT i, node, n, max;

  if (NULL == ref_interp) return REF_SUCCESS;

  n = ref_node_n(ref_grid_node(ref_interp_to_grid(ref_interp)));
  max = ref_interp_max(ref_interp);
  if (n > max) {
    RSS(ref_interp_resize(ref_interp, max), "match node max");
  }
  REIS(0, ref_agents_n(ref_interp->ref_agents), "can't pack active agents");

  for (node = 0; node < max; node++) {
    REIS(REF_FALSE, ref_interp->agent_hired[node], "can't pack hired agents");
  }

  ref_malloc(int_copy, max, REF_INT);
  for (node = 0; node < max; node++) {
    int_copy[node] = ref_interp->cell[node];
  }
  for (node = 0; node < n; node++) {
    ref_interp->cell[node] = int_copy[n2o[node]];
  }
  for (node = n; node < max; node++) {
    ref_interp->cell[node] = REF_EMPTY;
  }
  for (node = 0; node < max; node++) {
    int_copy[node] = ref_interp->part[node];
  }
  for (node = 0; node < n; node++) {
    ref_interp->part[node] = int_copy[n2o[node]];
  }
  for (node = n; node < max; node++) {
    ref_interp->part[node] = REF_EMPTY;
  }
  ref_free(int_copy);

  ref_malloc(dbl_copy, 4 * max, REF_DBL);
  for (node = 0; node < max; node++) {
    for (i = 0; i < 4; i++) {
      dbl_copy[i + 4 * node] = ref_interp->bary[i + 4 * node];
    }
  }
  for (node = 0; node < n; node++) {
    for (i = 0; i < 4; i++) {
      ref_interp->bary[i + 4 * node] = dbl_copy[i + 4 * n2o[node]];
    }
  }
  ref_free(dbl_copy);

  return REF_SUCCESS;
}